

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O2

iterator __thiscall
cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::Push
          (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *this,iterator it)

{
  iterator iVar1;
  BuildsystemDirectoryStateType BStack_238;
  
  memset(&BStack_238,0,0x1e0);
  BStack_238.Location.field_2._M_local_buf[0] = '\0';
  BStack_238.OutputLocation._M_dataplus._M_p = (pointer)&BStack_238.OutputLocation.field_2;
  BStack_238.OutputLocation.field_2._M_local_buf[0] = '\0';
  BStack_238.RelativePathTopSource._M_dataplus._M_p =
       (pointer)&BStack_238.RelativePathTopSource.field_2;
  BStack_238.RelativePathTopSource.field_2._M_local_buf[0] = '\0';
  BStack_238.RelativePathTopBinary._M_dataplus._M_p =
       (pointer)&BStack_238.RelativePathTopBinary.field_2;
  BStack_238.RelativePathTopBinary.field_2._M_local_buf[0] = '\0';
  BStack_238.Location._M_dataplus._M_p = (pointer)&BStack_238.Location.field_2;
  memset(&BStack_238.IncludeDirectories,0,0x108);
  BStack_238.ProjectName.field_2._M_local_buf[0] = '\0';
  BStack_238.Properties.Map_._M_h._M_buckets = &BStack_238.Properties.Map_._M_h._M_single_bucket;
  BStack_238.Properties.Map_._M_h._M_bucket_count = 1;
  BStack_238.Properties.Map_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  BStack_238.Properties.Map_._M_h._M_element_count = 0;
  BStack_238.Properties.Map_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  BStack_238.Properties.Map_._M_h._M_rehash_policy._M_next_resize = 0;
  BStack_238.Properties.Map_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  BStack_238.Children.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  BStack_238.Children.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  BStack_238.Children.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BStack_238.ProjectName._M_dataplus._M_p = (pointer)&BStack_238.ProjectName.field_2;
  iVar1 = Push_impl(this,it,&BStack_238);
  cmStateDetail::BuildsystemDirectoryStateType::~BuildsystemDirectoryStateType(&BStack_238);
  return iVar1;
}

Assistant:

iterator Push(iterator it) { return Push_impl(it, T()); }